

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseFunctionStmt(Parser *this,bool mustParseBody)

{
  bool bVar1;
  byte in_DL;
  undefined7 in_register_00000031;
  Parser *this_00;
  undefined1 local_220 [16];
  string local_210 [32];
  undefined1 local_1f0 [8];
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> body;
  undefined1 local_1e0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1c8;
  undefined1 local_1b8 [23];
  allocator<char> local_1a1;
  string local_1a0 [32];
  undefined1 local_180 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> returnTypename;
  string local_170;
  undefined1 local_14a;
  allocator<char> local_149;
  string local_148 [32];
  undefined1 local_128 [63];
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> params;
  string local_a8;
  undefined1 local_88 [8];
  Token name;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  Parser *pPStack_18;
  bool mustParseBody_local;
  Parser *this_local;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,mustParseBody);
  local_19 = in_DL & 1;
  pPStack_18 = this_00;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Expected function name.",&local_41);
  expect(this_00,IDENTIFIER,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  Token::Token((Token *)local_88,&this_00->m_previous);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Expected \'(\' after function name.",
             (allocator<char> *)
             ((long)&params.
                     super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expect(this_00,LEFT_PAREN,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&params.
                     super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::vector
            ((vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *)
             local_c8);
  bVar1 = consume(this_00,RIGHT_PAREN);
  if (!bVar1) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Expected parameter name.",&local_e9);
      expect(this_00,IDENTIFIER,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      Token::Token((Token *)local_128,&this_00->m_previous);
      local_14a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_148,"Expected parameter typename.",&local_149);
      expectTypename((Parser *)(local_128 + 0x30),(string *)this_00,SUB81(local_148,0));
      local_14a = 0;
      std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::
      push_back((vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *)
                local_c8,(value_type *)local_128);
      FunctionStmt::Param::~Param((Param *)local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator(&local_149);
      bVar1 = consume(this_00,COMMA);
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"Expected end of parameter list.",
               (allocator<char> *)
               ((long)&returnTypename._M_t.
                       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                       .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl + 7));
    expect(this_00,RIGHT_PAREN,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&returnTypename._M_t.
                       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                       .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"Expected return typename.",&local_1a1);
  expectTypenamePrecUnary((Parser *)local_180,(string *)this_00,SUB81(local_1a0,0));
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  if (((local_19 & 1) == 0) && (bVar1 = check(this_00,SEMICOLON), bVar1)) {
    local_1d8._M_allocated_capacity = 0;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = 0;
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
              *)(local_1e0 + 8));
    std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_1e0);
    std::
    make_unique<enact::BlockExpr,std::vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>,std::unique_ptr<enact::UnitExpr,std::default_delete<enact::UnitExpr>>>
              ((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
                *)local_1b8,
               (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)(local_1e0 + 8)
              );
    std::
    make_unique<enact::FunctionStmt,enact::Token&,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<enact::FunctionStmt::Param,std::allocator<enact::FunctionStmt::Param>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>>
              ((Token *)(local_1b8 + 8),
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_88,(vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                         *)local_180,
               (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_c8);
    std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>::
    unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>,void>
              ((unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>> *)this,
               (unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               (local_1b8 + 8));
    std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>::~unique_ptr
              ((unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               (local_1b8 + 8));
    std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
              ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_1b8);
    std::unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_>::~unique_ptr
              ((unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_1e0);
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
               *)(local_1e0 + 8));
    body._M_t.super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
    super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
    super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_210,"Expected \'{\' or \'=>\' before function body.",
               (allocator<char> *)(local_220 + 0xf));
    expectBlock((Parser *)local_1f0,(string *)this_00);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)(local_220 + 0xf));
    std::
    make_unique<enact::FunctionStmt,enact::Token,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<enact::FunctionStmt::Param,std::allocator<enact::FunctionStmt::Param>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>>
              ((Token *)local_220,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_88,(vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                         *)local_180,
               (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_c8);
    std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>::
    unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>,void>
              ((unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>> *)this,
               (unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               local_220);
    std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>::~unique_ptr
              ((unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               local_220);
    body._M_t.super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
    super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
    super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::~unique_ptr
              ((unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_1f0);
  }
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
             local_180);
  std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::~vector
            ((vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *)
             local_c8);
  Token::~Token((Token *)local_88);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseFunctionStmt(bool mustParseBody) {
        expect(TokenType::IDENTIFIER, "Expected function name.");
        Token name = m_previous;

        expect(TokenType::LEFT_PAREN, "Expected '(' after function name.");

        std::vector<FunctionStmt::Param> params;
        if (!consume(TokenType::RIGHT_PAREN)) {
            do {
                expect(TokenType::IDENTIFIER, "Expected parameter name.");
                params.push_back(FunctionStmt::Param{m_previous, expectTypename("Expected parameter typename.")});
            } while (consume(TokenType::COMMA));

            expect(TokenType::RIGHT_PAREN, "Expected end of parameter list.");
        }

        // Get the return type
        // At second-lowest precedence to force grouping of function types (because of => ambiguity)
        std::unique_ptr<const Typename> returnTypename =
                expectTypenamePrecUnary("Expected return typename.", true);

        if (!mustParseBody && check(TokenType::SEMICOLON)) {
            return std::make_unique<FunctionStmt>(name,
                                                  std::move(returnTypename),
                                                  std::move(params),
                                                  std::make_unique<BlockExpr>(std::vector<std::unique_ptr<Stmt>>{},
                                                                              std::make_unique<UnitExpr>(m_previous)));
        }

        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before function body.");
        return std::make_unique<FunctionStmt>(std::move(name), std::move(returnTypename), std::move(params), std::move(body));
    }